

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O0

int evfilt_proc_knote_create(filter *filt,knote *kn)

{
  int __fd;
  int iVar1;
  long lVar2;
  knote *in_RSI;
  int pfd;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if (((in_RSI->kev).fflags & 0x80000000) == 0) {
    (in_RSI->field_10).kn_timerfd = -1;
    local_4 = 0;
  }
  else {
    lVar2 = syscall(0x1b2,(in_RSI->kev).ident & 0xffffffff,0);
    __fd = (int)lVar2;
    if (__fd < 0) {
      local_4 = -1;
    }
    else {
      iVar1 = fcntl(__fd,2,1);
      if (iVar1 < 0) {
        local_4 = -1;
      }
      else {
        (in_RSI->field_10).kn_timerfd = __fd;
        (in_RSI->kev).flags = (in_RSI->kev).flags | 0x10;
        (in_RSI->kev).flags = (in_RSI->kev).flags | 0x20;
        (in_RSI->kn_udata).field_0.ud_kn = in_RSI;
        *(ulong *)&(in_RSI->kn_udata).ud_type = CONCAT44(in_stack_ffffffffffffffdc,1);
        local_4 = evfilt_proc_knote_enable((filter *)CONCAT44(in_stack_ffffffffffffffdc,1),in_RSI);
      }
    }
  }
  return local_4;
}

Assistant:

int
evfilt_proc_knote_create(struct filter *filt, struct knote *kn)
{
    int pfd;

    /* This mirrors the behaviour of kqueue if fflags doesn't specify any events */
    if (!(kn->kev.fflags & NOTE_EXIT)) {
        dbg_printf("not monitoring pid=%u as no NOTE_* fflags set", (unsigned int)kn->kev.ident);
        kn->kn_procfd = -1;
        return 0;
    }

    /* Returns an FD, which, when readable, indicates the process has exited */
    pfd = syscall(SYS_pidfd_open, (pid_t)kn->kev.ident, 0);
    if (pfd < 0) {
        dbg_perror("pidfd_open(2)");
        return (-1);
    }
    if (fcntl(pfd, F_SETFD, FD_CLOEXEC) < 0) {
        dbg_perror("fcntl(2)");
        return (-1);
    }
    dbg_printf("created pidfd=%i monitoring pid=%u", pfd, (unsigned int)kn->kev.ident);

    kn->kn_procfd = pfd;

    /*
     * These get added by default on macOS (and likely FreeBSD)
     * which make sense considering a process exiting is an
     * edge triggered event, not a level triggered one.
     */
    kn->kev.flags |= EV_ONESHOT;
    kn->kev.flags |= EV_CLEAR;

    KN_UDATA(kn);   /* populate this knote's kn_udata field */

    return evfilt_proc_knote_enable(filt, kn);
}